

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O3

QByteArrayView
QCryptographicHash::hashInto
          (QSpan<std::byte,_18446744073709551615UL> buffer,
          QSpan<const_QByteArrayView,_18446744073709551615UL> data,Algorithm method)

{
  uint uVar1;
  QByteArrayView *pQVar2;
  byte *pbVar3;
  ulong __n;
  QByteArrayView *pQVar4;
  iterator __begin1;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QCryptographicHashPrivate hash;
  State local_228 [416];
  undefined8 local_88;
  HashResult local_80;
  Algorithm local_3c;
  long local_38;
  
  pQVar2 = data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = hashLengthInternal(method);
  __n = 0;
  pbVar3 = (byte *)0x0;
  if ((long)(ulong)uVar1 <= buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_size) {
    memset(local_228,0xaa,0x1f0);
    QCryptographicHashPrivate::State::reset(local_228,method);
    local_88 = 0;
    local_3c = method;
    if (data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_size != 0) {
      pQVar4 = pQVar2 + data.super_QSpanBase<const_QByteArrayView,_18446744073709551615UL>.m_size;
      do {
        local_80.m_size = '\0';
        QCryptographicHashPrivate::State::addData(local_228,local_3c,*pQVar2);
        method = local_3c;
        local_80.m_size = '\0';
        pQVar2 = pQVar2 + 1;
      } while (pQVar2 != pQVar4);
      uVar1 = hashLengthInternal(local_3c);
    }
    local_80.m_size = (quint8)uVar1;
    QCryptographicHashPrivate::State::finalizeUnchecked(local_228,method,&local_80);
    __n = (ulong)local_80.m_size;
    memcpy(buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_data,&local_80,__n);
    pbVar3 = buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar5.m_data = (storage_type *)pbVar3;
    QVar5.m_size = __n;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QByteArrayView QCryptographicHash::hashInto(QSpan<std::byte> buffer,
                                            QSpan<const QByteArrayView> data,
                                            Algorithm method) noexcept
{
    if (buffer.size() < hashLengthInternal(method))
        return {}; // buffer too small

    QCryptographicHashPrivate hash(method);
    for (QByteArrayView part : data)
        hash.addData(part);
    hash.finalizeUnchecked(); // no mutex needed: no-one but us has access to 'hash'
    auto result = hash.resultView();
    Q_ASSERT(buffer.size() >= result.size());
    // ### optimize: have the method directly write into `buffer`
    memcpy(buffer.data(), result.data(), result.size());
    return buffer.first(result.size());
}